

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t count,float *value,
          polymorphic_allocator<float> *alloc)

{
  float *pfVar1;
  size_t sVar2;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->nStored = 0;
  this->ptr = (float *)0x0;
  this->nAlloc = 0;
  reserve(this,count);
  pfVar1 = this->ptr;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    pfVar1[sVar2] = *value;
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }